

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall aggreports::LoadReturnPeriods(aggreports *this)

{
  FILE *__stream;
  size_t sVar1;
  int return_period;
  
  if (this->useReturnPeriodFile_ != false) {
    __stream = fopen("input/returnperiods.bin","rb");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"FATAL: Error opening file %s\n","input/returnperiods.bin");
      exit(1);
    }
    while( true ) {
      sVar1 = fread(&return_period,4,1,__stream);
      if (sVar1 != 1) break;
      std::vector<int,_std::allocator<int>_>::push_back(&this->returnperiods_,&return_period);
    }
    fclose(__stream);
    if ((this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this->useReturnPeriodFile_ = false;
      fwrite("WARNING: Empty return periods file. Running without defined return periods option\n",
             0x52,1,_stderr);
    }
  }
  return;
}

Assistant:

void aggreports::LoadReturnPeriods() {

  if (useReturnPeriodFile_ == false) return;

  FILE *fin = fopen(RETURNPERIODS_FILE, "rb");
  if (fin == nullptr) {
    fprintf(stderr, "FATAL: Error opening file %s\n", RETURNPERIODS_FILE);
    exit(EXIT_FAILURE);
  }

  int return_period;
  while (fread(&return_period, sizeof(return_period), 1, fin) == 1) {
    returnperiods_.push_back(return_period);
  }

  fclose(fin);

  if (returnperiods_.size() == 0) {
    useReturnPeriodFile_ = false;
    fprintf(stderr, "WARNING: Empty return periods file. Running without "
		    "defined return periods option\n");
  }

}